

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Controller.cpp
# Opt level: O0

tuple<Move,_unsigned_long,_unsigned_long> * __thiscall
Controller::undoMove
          (tuple<Move,_unsigned_long,_unsigned_long> *__return_storage_ptr__,Controller *this)

{
  undefined1 auVar1 [16];
  bool bVar2;
  pointer this_00;
  unsigned_long *puVar3;
  pointer this_01;
  optional<unsigned_long> oVar4;
  Move local_44;
  uint local_40;
  Move move;
  uint col;
  uint row;
  Move local_30 [2];
  _Storage<unsigned_long,_true> local_28;
  optional<unsigned_long> position;
  Controller *this_local;
  
  position.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = this;
  this_00 = std::unique_ptr<UndoMove,_std::default_delete<UndoMove>_>::operator->
                      (&this->undoMoveService);
  oVar4 = UndoMove::GetMove(this_00);
  local_28._M_value =
       oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  position.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_1_ =
       oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_engaged;
  bVar2 = std::operator==(&local_28);
  if (bVar2) {
    local_30[0] = NOT_ALLOWED;
    row = 0;
    col = 0;
    std::tuple<Move,_unsigned_long,_unsigned_long>::tuple<Move,_int,_int,_true,_true>
              (__return_storage_ptr__,local_30,(int *)&row,(int *)&col);
  }
  else {
    puVar3 = std::optional<unsigned_long>::value((optional<unsigned_long> *)&local_28);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = *puVar3;
    move = SUB164(auVar1 / ZEXT816(10),0);
    puVar3 = std::optional<unsigned_long>::value((optional<unsigned_long> *)&local_28);
    local_40 = (uint)(*puVar3 % 10);
    this_01 = std::unique_ptr<Board,_std::default_delete<Board>_>::operator->(&this->board);
    local_44 = Board::checkMove(this_01,(ulong)move,(ulong)local_40);
    std::tuple<Move,_unsigned_long,_unsigned_long>::
    tuple<Move_&,_unsigned_int_&,_unsigned_int_&,_true,_true>
              (__return_storage_ptr__,&local_44,&move,&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

std::tuple<Move, size_t, size_t> Controller::undoMove()
{
    std::optional<size_t> position = undoMoveService->GetMove();
    if ( position == std::nullopt )
    {
        return { Move::NOT_ALLOWED, 0, 0 };
    }

    uint row = position.value() / 10;
    uint col = position.value() % 10;
    Move move = board->checkMove( row, col );
    return { move, row, col };
}